

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O2

bool Guest_ContactHost(void *userdata)

{
  int iVar1;
  sockaddr_in *address;
  _func_int **pp_Var2;
  ulong uVar3;
  char *error;
  PreGamePacket packet;
  
  packet.Fake = '0';
  packet.Message = '\0';
  PreSend(&packet,2,sendaddress + 1);
  do {
    while( true ) {
      do {
        do {
          address = PreGet(&packet,0x44,true);
          if (address == (sockaddr_in *)0x0) {
            pp_Var2 = StartScreen->_vptr_FStartupScreen;
            uVar3 = 0;
            goto LAB_0046690c;
          }
        } while (packet.Fake != '0');
        iVar1 = FindNode(address);
      } while (iVar1 != 1);
      error = "The host cancelled the game.";
      if (packet.Message != '\x02') break;
LAB_004668ee:
      doomcom.numnodes = 0;
      I_FatalError(error);
    }
    if (packet.Message == '\x05') {
      error = "The game is full.";
      goto LAB_004668ee;
    }
  } while (packet.Message != '\x04');
  (*StartScreen->_vptr_FStartupScreen[7])(StartScreen,"Total players: %d",(ulong)packet.NumNodes);
  (*StartScreen->_vptr_FStartupScreen[5])
            (StartScreen,"Waiting for other players",(ulong)packet.NumNodes);
  uVar3 = (ulong)packet.field_3.ConsoleNum;
  pp_Var2 = StartScreen->_vptr_FStartupScreen;
LAB_0046690c:
  (*pp_Var2[6])(StartScreen,uVar3);
  return address != (sockaddr_in *)0x0;
}

Assistant:

bool Guest_ContactHost (void *userdata)
{
	sockaddr_in *from;
	PreGamePacket packet;

	// Let the host know we are here.
	packet.Fake = PRE_FAKE;
	packet.Message = PRE_CONNECT;
	PreSend (&packet, 2, &sendaddress[1]);

	// Listen for a reply.
	while ( (from = PreGet (&packet, sizeof(packet), true)) )
	{
		if (packet.Fake == PRE_FAKE && FindNode(from) == 1)
		{
			if (packet.Message == PRE_CONACK)
			{
				StartScreen->NetMessage ("Total players: %d", packet.NumNodes);
				StartScreen->NetInit ("Waiting for other players", packet.NumNodes);
				StartScreen->NetProgress (packet.NumPresent);
				return true;
			}
			else if (packet.Message == PRE_DISCONNECT)
			{
				doomcom.numnodes = 0;
				I_FatalError ("The host cancelled the game.");
			}
			else if (packet.Message == PRE_ALLFULL)
			{
				doomcom.numnodes = 0;
				I_FatalError ("The game is full.");
			}
		}
	}

	// In case the progress bar could not be marqueed, bump it.
	StartScreen->NetProgress (0);

	return false;
}